

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RotationZZ.hpp
# Opt level: O0

RotationZZ<std::complex<float>_> *
qclab::qgates::operator*
          (RotationZZ<std::complex<float>_> *__return_storage_ptr__,
          RotationZZ<std::complex<float>_> *lhs,RotationZZ<std::complex<float>_> *rhs)

{
  int iVar1;
  int iVar2;
  RotationZZ<std::complex<float>_> *rhs_local;
  RotationZZ<std::complex<float>_> *lhs_local;
  
  iVar1 = QRotationGate2<std::complex<float>_>::qubit
                    (&lhs->super_QRotationGate2<std::complex<float>_>);
  iVar2 = (*(rhs->super_QRotationGate2<std::complex<float>_>).super_QGate2<std::complex<float>_>.
            super_QObject<std::complex<float>_>._vptr_QObject[3])();
  if (iVar1 == iVar2) {
    RotationZZ<std::complex<float>_>::operator*=(lhs,rhs);
    RotationZZ<std::complex<float>_>::RotationZZ(__return_storage_ptr__,lhs);
    return __return_storage_ptr__;
  }
  __assert_fail("lhs.qubit() == rhs.qubit()",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/include/qclab/qgates/RotationZZ.hpp"
                ,0xca,"RotationZZ<T> qclab::qgates::operator*(RotationZZ<T>, const RotationZZ<T> &)"
               );
}

Assistant:

RotationZZ< T > operator*( RotationZZ< T > lhs ,
                                         const RotationZZ< T >& rhs ) {
          assert( lhs.qubit() == rhs.qubit() ) ;
          lhs *= rhs ;
          return lhs ;
        }